

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

int QMetaTypeIdQObject<QDnsTlsAssociationRecord,_512>::qt_metatype_id(void)

{
  char *pcVar1;
  long in_FS_OFFSET;
  int newId;
  char *cName;
  int id;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_24;
  QByteArray local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = QBasicAtomicInteger<int>::loadAcquire((QBasicAtomicInteger<int> *)0x356b92);
  if (local_24 == 0) {
    pcVar1 = (char *)QMetaObject::className();
    QByteArray::QByteArray(&local_20,pcVar1,-1);
    local_24 = qRegisterNormalizedMetaType<QDnsTlsAssociationRecord>((QByteArray *)0x356bd8);
    QByteArray::~QByteArray((QByteArray *)0x356be6);
    QBasicAtomicInteger<int>::storeRelease
              ((QBasicAtomicInteger<int> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_24;
}

Assistant:

static int qt_metatype_id()
    {
        Q_CONSTINIT static QBasicAtomicInt metatype_id = Q_BASIC_ATOMIC_INITIALIZER(0);
        if (const int id = metatype_id.loadAcquire())
            return id;
        const char *const cName = T::staticMetaObject.className();
        const int newId = qRegisterNormalizedMetaType<T>(cName);
        metatype_id.storeRelease(newId);
        return newId;
    }